

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EbmlMaster.cpp
# Opt level: O2

bool __thiscall
libebml::EbmlMaster::InsertElement(EbmlMaster *this,EbmlElement *element,size_t position)

{
  EbmlElement **ppEVar1;
  EbmlElement **ppEVar2;
  EbmlElement **ppEVar3;
  const_iterator __position;
  size_t sVar4;
  bool bVar5;
  EbmlElement *local_10;
  
  ppEVar3 = (this->ElementList).
            super__Vector_base<libebml::EbmlElement_*,_std::allocator<libebml::EbmlElement_*>_>.
            _M_impl.super__Vector_impl_data._M_start;
  ppEVar2 = (this->ElementList).
            super__Vector_base<libebml::EbmlElement_*,_std::allocator<libebml::EbmlElement_*>_>.
            _M_impl.super__Vector_impl_data._M_finish;
  ppEVar1 = ppEVar3 + position;
  while ((__position._M_current = ppEVar3, sVar4 = position, ppEVar3 != ppEVar2 &&
         (bVar5 = position != 0, position = position - 1, __position._M_current = ppEVar1,
         sVar4 = 0xffffffffffffffff, bVar5))) {
    ppEVar3 = ppEVar3 + 1;
  }
  if (sVar4 == 0 || __position._M_current != ppEVar2) {
    local_10 = element;
    std::vector<libebml::EbmlElement_*,_std::allocator<libebml::EbmlElement_*>_>::_M_insert_rval
              (&this->ElementList,__position,&local_10);
  }
  return sVar4 == 0 || __position._M_current != ppEVar2;
}

Assistant:

bool EbmlMaster::InsertElement(EbmlElement & element, size_t position)
{
  std::vector<EbmlElement *>::iterator Itr = ElementList.begin();
  while (Itr != ElementList.end() && position--)
  {
    ++Itr;
  }
  if ((Itr == ElementList.end()) && position)
    return false;

  ElementList.insert(Itr, &element);
  return true;
}